

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tgatexture.cpp
# Opt level: O2

void __thiscall FTGATexture::~FTGATexture(FTGATexture *this)

{
  ~FTGATexture(this);
  operator_delete(this,0x68);
  return;
}

Assistant:

FTGATexture::~FTGATexture ()
{
	Unload ();
	if (Spans != NULL)
	{
		FreeSpans (Spans);
		Spans = NULL;
	}
}